

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.c
# Opt level: O1

void * Stack_Pop(Stack *stack)

{
  Stack_Node *__ptr;
  void *pvVar1;
  
  __ptr = stack->first;
  if (__ptr == (Stack_Node *)0x0) {
    pvVar1 = (void *)0x0;
  }
  else {
    pvVar1 = __ptr->data;
    stack->size = stack->size - 1;
    stack->first = __ptr->next;
    free(__ptr);
  }
  return pvVar1;
}

Assistant:

void* Stack_Pop(Stack *stack)
{
    void* return_value=NULL;
    if(stack->first!=NULL)
    {
        struct Stack_Node *temp_first=stack->first;
        return_value=stack->first->data;

        --stack->size;
        stack->first=stack->first->next;
        free(temp_first);
    }

    return return_value;
}